

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,LogicalType *child_type,
                          vector<duckdb::Value,_true> *values)

{
  Value *pVVar1;
  Value *pVVar2;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar3;
  LogicalType *key_type;
  LogicalType *pLVar4;
  pointer pVVar5;
  Value *pVVar6;
  Value *val;
  pointer pVVar7;
  vector<duckdb::Value,_true> map_values;
  vector<duckdb::Value,_true> map_keys;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unique_keys;
  Value *local_108;
  Value *pVStack_100;
  pointer local_f8;
  Value *local_e8;
  Value *pVStack_e0;
  pointer local_d8;
  vector<duckdb::Value,_true> local_c8;
  vector<duckdb::Value,_true> local_a8;
  Value *local_88;
  LogicalType *local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  
  local_d8 = (pointer)0x0;
  local_e8 = (Value *)0x0;
  pVStack_e0 = (Value *)0x0;
  local_f8 = (pointer)0x0;
  local_108 = (Value *)0x0;
  pVStack_100 = (Value *)0x0;
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  pVVar7 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = __return_storage_ptr__;
  local_80 = child_type;
  if (pVVar7 != pVVar5) {
    do {
      this = StructValue::GetChildren(pVVar7);
      pvVar3 = vector<duckdb::Value,_true>::operator[](this,0);
      MapKeyCheck((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_78,pvVar3);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e8,pvVar3);
      pvVar3 = vector<duckdb::Value,_true>::operator[](this,1);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_108,pvVar3);
      pVVar7 = pVVar7 + 1;
    } while (pVVar7 != pVVar5);
  }
  pLVar4 = local_80;
  key_type = StructType::GetChildType(local_80,0);
  pLVar4 = StructType::GetChildType(pLVar4,1);
  pVVar2 = local_88;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_e8;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_e0;
  local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_d8;
  local_e8 = (Value *)0x0;
  pVStack_e0 = (Value *)0x0;
  local_d8 = (pointer)0x0;
  local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_108;
  local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_100;
  local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_f8;
  local_108 = (Value *)0x0;
  pVStack_100 = (Value *)0x0;
  local_f8 = (pointer)0x0;
  MAP(local_88,key_type,pLVar4,&local_a8,&local_c8);
  pVVar7 = local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar5 = local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar5 != pVVar7; pVVar5 = pVVar5 + 1) {
    ~Value(pVVar5);
  }
  pVVar6 = local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (Value *)0x0) {
    operator_delete(local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pVVar6 = local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar1 = local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pVVar6 != pVVar1; pVVar6 = pVVar6 + 1) {
    ~Value(pVVar6);
  }
  if (local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (Value *)0x0) {
    operator_delete(local_a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78);
  pVVar1 = pVStack_100;
  for (pVVar6 = local_108; pVVar6 != pVVar1; pVVar6 = pVVar6 + 1) {
    ~Value(pVVar6);
  }
  pVVar6 = local_e8;
  pVVar1 = pVStack_e0;
  if (local_108 != (Value *)0x0) {
    operator_delete(local_108);
    pVVar6 = local_e8;
    pVVar1 = pVStack_e0;
  }
  for (; pVVar6 != pVVar1; pVVar6 = pVVar6 + 1) {
    ~Value(pVVar6);
  }
  if (local_e8 != (Value *)0x0) {
    operator_delete(local_e8);
  }
  return pVVar2;
}

Assistant:

Value Value::MAP(const LogicalType &child_type, vector<Value> values) { // NOLINT
	vector<Value> map_keys;
	vector<Value> map_values;
	unordered_set<hash_t> unique_keys;

	for (auto &val : values) {
		D_ASSERT(val.type().InternalType() == PhysicalType::STRUCT);
		auto &children = StructValue::GetChildren(val);
		D_ASSERT(children.size() == 2);

		auto &key = children[0];
		MapKeyCheck(unique_keys, key);

		map_keys.push_back(key);
		map_values.push_back(children[1]);
	}

	auto &key_type = StructType::GetChildType(child_type, 0);
	auto &value_type = StructType::GetChildType(child_type, 1);
	return Value::MAP(key_type, value_type, std::move(map_keys), std::move(map_values));
}